

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PlatformIs64Bit(cmMakefile *this)

{
  int iVar1;
  cmValue cVar2;
  bool bVar3;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_SIZEOF_VOID_P",&local_31);
  cVar2 = GetDefinition(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (cVar2.Value == (string *)0x0) {
    bVar3 = false;
  }
  else {
    iVar1 = atoi(((cVar2.Value)->_M_dataplus)._M_p);
    bVar3 = iVar1 == 8;
  }
  return bVar3;
}

Assistant:

bool cmMakefile::PlatformIs64Bit() const
{
  if (cmValue sizeof_dptr = this->GetDefinition("CMAKE_SIZEOF_VOID_P")) {
    return atoi(sizeof_dptr->c_str()) == 8;
  }
  return false;
}